

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.h
# Opt level: O3

void __thiscall duckdb_skiplistlib::skip_list::Exception::Exception(Exception *this,string *in_msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_02479c50;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  pcVar1 = (in_msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar1,pcVar1 + in_msg->_M_string_length);
  return;
}

Assistant:

explicit Exception(const std::string &in_msg) : msg(in_msg) {}